

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

Cnf_Dat_t * Cnf_DeriveSimple(Aig_Man_t *p,int nOutputs)

{
  void **ppvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  int *piVar6;
  Cnf_Dat_t *pCVar7;
  int **ppiVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  Vec_Ptr_t *pVVar14;
  long lVar15;
  
  iVar10 = p->nObjs[6] + p->nObjs[5];
  iVar12 = p->nObjs[3] + nOutputs * 3 + 1 + iVar10 * 7;
  iVar10 = p->nObjs[3] + nOutputs + 1 + iVar10 * 3;
  pCVar7 = (Cnf_Dat_t *)malloc(0x48);
  pCVar7->pMan = (Aig_Man_t *)0x0;
  pCVar7->nVars = 0;
  pCVar7->nLiterals = 0;
  *(undefined8 *)&pCVar7->nClauses = 0;
  pCVar7->pClauses = (int **)0x0;
  pCVar7->pVarNums = (int *)0x0;
  pCVar7->pObj2Clause = (int *)0x0;
  pCVar7->pObj2Count = (int *)0x0;
  pCVar7->pClaPols = (uchar *)0x0;
  pCVar7->vMapping = (Vec_Int_t *)0x0;
  pCVar7->pMan = p;
  pCVar7->nLiterals = iVar12;
  pCVar7->nClauses = iVar10;
  lVar15 = (long)iVar10;
  ppiVar8 = (int **)malloc(lVar15 * 8 + 8);
  pCVar7->pClauses = ppiVar8;
  lVar13 = (long)iVar12;
  piVar9 = (int *)malloc(lVar13 * 4);
  *ppiVar8 = piVar9;
  ppiVar8[lVar15] = piVar9 + lVar13;
  pVVar14 = p->vObjs;
  iVar10 = pVVar14->nSize;
  piVar9 = (int *)malloc((long)iVar10 * 4);
  pCVar7->pVarNums = piVar9;
  if (0 < (long)iVar10) {
    lVar11 = 0;
    do {
      piVar9[lVar11] = -1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar14->nSize);
  }
  iVar10 = 1;
  if ((nOutputs != 0) && (pVVar3 = p->vCos, 0 < pVVar3->nSize)) {
    ppvVar4 = pVVar3->pArray;
    lVar11 = 0;
    do {
      ppvVar1 = ppvVar4 + lVar11;
      lVar11 = lVar11 + 1;
      piVar9[*(int *)((long)*ppvVar1 + 0x24)] = (int)lVar11;
    } while (lVar11 < pVVar3->nSize);
    iVar10 = (int)lVar11 + 1;
  }
  if (0 < pVVar14->nSize) {
    ppvVar4 = pVVar14->pArray;
    lVar11 = 0;
    do {
      pvVar5 = ppvVar4[lVar11];
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
        piVar9[*(int *)((long)pvVar5 + 0x24)] = iVar10;
        iVar10 = iVar10 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar14->nSize);
  }
  pVVar14 = p->vCis;
  if (0 < pVVar14->nSize) {
    ppvVar4 = pVVar14->pArray;
    lVar11 = 0;
    do {
      piVar9[*(int *)((long)ppvVar4[lVar11] + 0x24)] = iVar10 + (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar14->nSize);
    iVar10 = iVar10 + (int)lVar11;
  }
  piVar9[p->pConst1->Id] = iVar10;
  pCVar7->nVars = iVar10 + 1;
  piVar9 = *ppiVar8;
  pVVar14 = p->vObjs;
  iVar10 = pVVar14->nSize;
  if (0 < iVar10) {
    lVar11 = 0;
    do {
      pvVar5 = pVVar14->pArray[lVar11];
      if ((pvVar5 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar5 + 0x18) & 7) - 7)) {
        piVar6 = pCVar7->pVarNums;
        iVar10 = piVar6[*(int *)((long)pvVar5 + 0x24)];
        iVar12 = piVar6[*(int *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x24)];
        iVar2 = piVar6[*(int *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 0x24)];
        *ppiVar8 = piVar9;
        *piVar9 = iVar10 * 2;
        piVar9[1] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar12 * 2 ^ 1;
        piVar9[2] = (*(uint *)((long)pvVar5 + 0x10) & 1) + iVar2 * 2 ^ 1;
        ppiVar8[1] = piVar9 + 3;
        iVar10 = iVar10 * 2 + 1;
        piVar9[3] = iVar10;
        piVar9[4] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar12 * 2;
        ppiVar8[2] = piVar9 + 5;
        ppiVar8 = ppiVar8 + 3;
        piVar9[5] = iVar10;
        piVar9[6] = (*(uint *)((long)pvVar5 + 0x10) & 1) + iVar2 * 2;
        piVar9 = piVar9 + 7;
      }
      lVar11 = lVar11 + 1;
      pVVar14 = p->vObjs;
      iVar10 = pVVar14->nSize;
    } while (lVar11 < iVar10);
  }
  iVar12 = pCVar7->pVarNums[p->pConst1->Id];
  if (iVar12 <= iVar10) {
    *ppiVar8 = piVar9;
    ppiVar8 = ppiVar8 + 1;
    *piVar9 = iVar12 * 2;
    piVar9 = piVar9 + 1;
    pVVar14 = p->vCos;
    if (0 < pVVar14->nSize) {
      lVar11 = 0;
      do {
        pvVar5 = pVVar14->pArray[lVar11];
        iVar10 = pCVar7->pVarNums
                 [*(int *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x24)];
        if (lVar11 < (long)p->nObjs[3] - (long)nOutputs) {
          *ppiVar8 = piVar9;
          *piVar9 = (*(uint *)((long)pvVar5 + 8) & 1) + iVar10 * 2;
          piVar9 = piVar9 + 1;
          ppiVar8 = ppiVar8 + 1;
        }
        else {
          iVar12 = pCVar7->pVarNums[*(int *)((long)pvVar5 + 0x24)];
          *ppiVar8 = piVar9;
          *piVar9 = iVar12 * 2;
          piVar9[1] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar10 * 2 ^ 1;
          ppiVar8[1] = piVar9 + 2;
          ppiVar8 = ppiVar8 + 2;
          piVar9[2] = iVar12 * 2 + 1;
          piVar9[3] = (*(uint *)((long)pvVar5 + 8) & 1) + iVar10 * 2;
          piVar9 = piVar9 + 4;
        }
        lVar11 = lVar11 + 1;
        pVVar14 = p->vCos;
      } while (lVar11 < pVVar14->nSize);
    }
    if ((long)piVar9 - (long)*pCVar7->pClauses >> 2 == lVar13) {
      if ((long)ppiVar8 - (long)pCVar7->pClauses >> 3 == lVar15) {
        return pCVar7;
      }
      __assert_fail("pClas - pCnf->pClauses == nClauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                    ,0x2b4,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
    }
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,0x2b3,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
  }
  __assert_fail("OutVar <= Aig_ManObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                ,0x297,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
}

Assistant:

Cnf_Dat_t * Cnf_DeriveSimple( Aig_Man_t * p, int nOutputs )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    int i, nLiterals, nClauses, Number;

    // count the number of literals and clauses
    nLiterals = 1 + 7 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + 3 * nOutputs;
    nClauses = 1 + 3 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + nOutputs;

    // allocate CNF
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = p;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;

    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p) );
    for ( i = 0; i < Aig_ManObjNumMax(p); i++ )
        pCnf->pVarNums[i] = -1;
    // assign variables to the last (nOutputs) POs
    Number = 1;
    if ( nOutputs )
    {
//        assert( nOutputs == Aig_ManRegNum(p) );
//        Aig_ManForEachLiSeq( p, pObj, i )
//            pCnf->pVarNums[pObj->Id] = Number++;
        Aig_ManForEachCo( p, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
    }
    // assign variables to the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    pCnf->pVarNums[Aig_ManConst1(p)->Id] = Number++;
    pCnf->nVars = Number;
/*
    // print CNF numbers
    printf( "SAT numbers of each node:\n" );
    Aig_ManForEachObj( p, pObj, i )
        printf( "%d=%d ", pObj->Id, pCnf->pVarNums[pObj->Id] );
    printf( "\n" );
*/
    // assign the clauses
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Aig_ManForEachNode( p, pObj, i )
    {
        OutVar   = pCnf->pVarNums[ pObj->Id ];
        pVars[0] = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        pVars[1] = pCnf->pVarNums[ Aig_ObjFanin1(pObj)->Id ];

        // positive phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar; 
        *pLits++ = 2 * pVars[0] + !Aig_ObjFaninC0(pObj); 
        *pLits++ = 2 * pVars[1] + !Aig_ObjFaninC1(pObj); 
        // negative phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[0] + Aig_ObjFaninC0(pObj); 
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[1] + Aig_ObjFaninC1(pObj); 
    }
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar;  

    // write the output literals
    Aig_ManForEachCo( p, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar  = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
    return pCnf;
}